

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Count
          (UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL> *this)

{
  ulong uVar1;
  UnorderedArrayListLink *pUVar2;
  ulong uVar3;
  
  uVar1 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
  if (uVar1 < 0x18030) {
    uVar1 = (uVar1 & 0xffffffff) / 0x30;
    pUVar2 = (this->m_inlineHeadBlock).Next;
    while( true ) {
      if (pUVar2 == (UnorderedArrayListLink *)0x0) {
        return (uint32)uVar1;
      }
      uVar3 = (long)pUVar2->CurrPos - (long)pUVar2->BlockData;
      if (0x1802f < uVar3) break;
      uVar1 = (ulong)((uint32)uVar1 + (int)((uVar3 & 0xffffffff) / 0x30));
      pUVar2 = pUVar2->Next;
    }
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }